

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O2

int psort_(double *a,int n,int *ind,int ni)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  int iVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  int local_14c [3];
  int il [16];
  int iu [16];
  int indl [16];
  int indu [16];
  
  uVar14 = (ulong)(uint)n;
  uVar6 = (ulong)(uint)ni;
  if (((ni | n) < 0) || (ni == 0 || n < 2)) {
    return 0;
  }
  iu[0xe] = 1;
  indl[0xe] = ni;
  iVar18 = 1;
  iVar10 = 1;
  do {
    iVar1 = 1;
    uVar12 = (uint)uVar14;
    iVar11 = iVar10;
    if (1 < (int)uVar12) goto LAB_0014caa8;
LAB_0014ca3c:
    lVar4 = (long)iVar11;
    lVar9 = 0;
    do {
      lVar8 = lVar9;
      if (1 - lVar4 == lVar8) {
        return 0;
      }
      iVar18 = iu[lVar4 + lVar8 + 0xc];
      uVar6 = (ulong)(uint)indl[lVar4 + lVar8 + 0xc];
      lVar9 = lVar8 + -1;
    } while (indl[lVar4 + lVar8 + 0xc] < iVar18);
    uVar14 = (ulong)(uint)il[lVar4 + lVar8 + 0xc];
    iVar1 = local_14c[lVar4 + lVar9];
    iVar17 = il[lVar4 + lVar8 + 0xc] - local_14c[lVar4 + lVar9];
    iVar10 = iVar11 + (int)lVar9;
    while (uVar12 = (uint)uVar14, 10 < iVar17) {
LAB_0014caa8:
      lVar9 = (long)((int)(uVar12 + iVar1) / 2);
      dVar19 = a[lVar9 + -1];
      if (dVar19 < a[(long)iVar1 + -1]) {
        a[lVar9 + -1] = a[(long)iVar1 + -1];
        a[(long)iVar1 + -1] = dVar19;
        dVar19 = a[lVar9 + -1];
      }
      uVar14 = (ulong)(int)uVar12;
      iVar3 = iVar1;
      if (a[uVar14 - 1] < dVar19) {
        a[lVar9 + -1] = a[uVar14 - 1];
        a[uVar14 - 1] = dVar19;
        dVar19 = a[lVar9 + -1];
        if (dVar19 < a[(long)iVar1 + -1]) {
          a[lVar9 + -1] = a[(long)iVar1 + -1];
          a[(long)iVar1 + -1] = dVar19;
          dVar19 = a[lVar9 + -1];
        }
      }
      while( true ) {
        do {
          uVar15 = uVar14;
          dVar20 = a[uVar15 - 2];
          uVar14 = uVar15 - 1;
        } while (dVar19 < dVar20);
        lVar9 = ((long)iVar3 << 0x20) + -0x100000000;
        pdVar7 = a + iVar3;
        do {
          iVar2 = iVar3;
          pdVar16 = pdVar7;
          lVar9 = lVar9 + 0x100000000;
          iVar3 = iVar2 + 1;
          pdVar7 = pdVar16 + 1;
        } while (*pdVar16 < dVar19);
        if ((long)uVar14 <= lVar9 >> 0x20) break;
        a[uVar15 - 2] = *pdVar16;
        *pdVar16 = (double)(int)dVar20;
      }
      iu[(long)iVar10 + 0xd] = iVar18;
      iVar5 = (int)uVar6;
      indl[(long)iVar10 + 0xd] = iVar5;
      iVar11 = iVar10 + 1;
      iVar13 = (int)uVar14;
      iVar17 = iVar13 - iVar1;
      lVar9 = (long)iVar18;
      if ((int)(uVar12 - iVar3) < iVar17) {
        local_14c[iVar10] = iVar1;
        il[(long)iVar10 + 0xd] = iVar13;
        while( true ) {
          if (iVar5 < lVar9) goto LAB_0014ca3c;
          if (iVar2 < ind[lVar9 + -1]) break;
          lVar9 = lVar9 + 1;
        }
        iVar18 = (int)lVar9;
        indl[(long)iVar10 + 0xd] = iVar18 + -1;
        uVar14 = (ulong)uVar12;
        iVar1 = iVar3;
        iVar17 = uVar12 - iVar3;
        iVar10 = iVar11;
      }
      else {
        uVar6 = (ulong)iVar5;
        local_14c[iVar10] = iVar3;
        il[(long)iVar10 + 0xd] = uVar12;
        while( true ) {
          if ((long)uVar6 < lVar9) goto LAB_0014ca3c;
          if (ind[uVar6 - 1] < iVar13 + 1) break;
          uVar6 = uVar6 - 1;
        }
        iu[(long)iVar10 + 0xd] = (int)uVar6 + 1;
        iVar10 = iVar11;
      }
    }
  } while (iVar1 == 1);
  lVar4 = (long)iVar1;
  pdVar7 = a + lVar4;
  lVar9 = (long)(iVar1 + -1);
  while (iVar11 = iVar10, uVar12 != (uint)(lVar9 + 1)) {
    dVar19 = a[lVar9 + 1];
    if (dVar19 < a[lVar9]) {
      dVar20 = a[lVar4 + -1];
      pdVar16 = pdVar7;
      do {
        *pdVar16 = dVar20;
        dVar20 = pdVar16[-2];
        pdVar16 = pdVar16 + -1;
      } while (dVar19 < dVar20);
      *pdVar16 = dVar19;
    }
    lVar4 = lVar4 + 1;
    pdVar7 = pdVar7 + 1;
    lVar9 = lVar9 + 1;
  }
  goto LAB_0014ca3c;
}

Assistant:

int psort_(double *a, int n, int *ind, int ni)
{
    int i__, j, k, l, m, p;
    double t;
    int ij, il[16], jl, iu[16], ju;
    int tt;
    int indl[16], indu[16];


/* Partial Sorting ; used for Median (MAD) computation only */

/* Arg */
/* Var */
    /* Parameter adjustments */
    --a;
    --ind;

    /* Function Body */
    if (n < 0 || ni < 0) {
	return 0;
    }
    if (n < 2 || ni == 0) {
	return 0;
    }
    jl = 1;
    ju = ni;
    indl[0] = 1;
    indu[0] = ni;
    i__ = 1;
    j = n;
    m = 1;
/* Outer Loop */
L161:
    if (i__ < j) {
	goto L10;
    }
/*  _Loop_ */
L166:
    --m;
    if (m == 0) {
	return 0;
    }
    i__ = il[m - 1];
    j = iu[m - 1];
    jl = indl[m - 1];
    ju = indu[m - 1];
    if (! (jl <= ju)) {
	goto L166;
    }
/*     while (j - i > 10) */
L173:
    if (! (j - i__ > 10)) {
	goto L174;
    }
L10:
    k = i__;
    ij = (i__ + j) / 2;
    t = a[ij];
    if (a[i__] > t) {
	a[ij] = a[i__];
	a[i__] = t;
	t = a[ij];
    }
    l = j;
    if (a[j] < t) {
	a[ij] = a[j];
	a[j] = t;
	t = a[ij];
	if (a[i__] > t) {
	    a[ij] = a[i__];
	    a[i__] = t;
	    t = a[ij];
	}
    }
L181:
    --l;
    if (a[l] <= t) {
	tt = a[l];
L186:
	++k;
/* L187: */
	if (! (a[k] >= t)) {
	    goto L186;
	}
	if (k > l) {
	    goto L183;
	}
	a[l] = a[k];
	a[k] = tt;
    }
/* L182: */
    goto L181;
L183:
    indl[m - 1] = jl;
    indu[m - 1] = ju;
    p = m;
    ++m;
    if (l - i__ <= j - k) {
	il[p - 1] = k;
	iu[p - 1] = j;
	j = l;
L193:
	if (jl > ju) {
	    goto L166;
	}
	if (ind[ju] > j) {
	    --ju;
	    goto L193;
	}
	indl[p - 1] = ju + 1;
    } else {
	il[p - 1] = i__;
	iu[p - 1] = l;
	i__ = k;
L200:
	if (jl > ju) {
	    goto L166;
	}
	if (ind[jl] < i__) {
	    ++jl;
	    goto L200;
	}
	indu[p - 1] = jl - 1;
    }
    goto L173;
/*     end while */
L174:
    if (i__ != 1) {
	--i__;
L209:
	++i__;
	if (i__ == j) {
	    goto L166;
	}
	t = a[i__ + 1];
	if (a[i__] > t) {
	    k = i__;
/*           repeat */
L216:
	    a[k + 1] = a[k];
	    --k;
	    if (! (t >= a[k])) {
		goto L216;
	    }
/*           until  t >= a(k) */
	    a[k + 1] = t;
	}
	goto L209;
    }
    goto L161;
/* End Outer Loop */
}